

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

PVIPNode * pvip_node_alloc(pvip_t *pvip)

{
  int iVar1;
  pvip_arena *ppVar2;
  pvip_arena *ppVar3;
  
  ppVar2 = pvip->arena;
  iVar1 = ppVar2->idx;
  ppVar3 = ppVar2;
  if ((long)iVar1 == 0x400) {
    ppVar3 = (pvip_arena *)malloc(0x6010);
    if (ppVar3 == (pvip_arena *)0x0) {
      fwrite("[PVIP] Cannot allocate memory",0x1d,1,_stderr);
      abort();
    }
    ppVar3->next = ppVar2;
    pvip->arena = ppVar3;
  }
  ppVar3->idx = iVar1 + 1;
  return ppVar3->nodes + iVar1;
}

Assistant:

PVIPNode* pvip_node_alloc(struct pvip_t* pvip) {
    if (pvip->arena->idx==PVIP_ARENA_SIZE) {
        struct pvip_arena* arena = malloc(sizeof(struct pvip_arena));
        ALLOC_CHECK(arena);
        arena->next = pvip->arena;
        pvip->arena = arena;
    }
    return &(pvip->arena->nodes[pvip->arena->idx++]);
}